

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O2

void __thiscall
ASDCP::Wav::SimpleWaveHeader::FillADesc
          (SimpleWaveHeader *this,AudioDescriptor *ADesc,Rational PictureRate)

{
  ui32_t uVar1;
  
  ADesc->EditRate = PictureRate;
  ADesc->LinkedTrackID = 0;
  ADesc->Locked = 0;
  ADesc->ChannelCount = (uint)this->nchannels;
  ADesc->AudioSamplingRate = (Rational)((ulong)this->samplespersec | 0x100000000);
  ADesc->AvgBps = this->avgbps;
  ADesc->BlockAlign = (uint)this->blockalign;
  ADesc->QuantizationBits = (uint)this->bitspersample;
  uVar1 = PCM::CalcFrameBufferSize(ADesc);
  ADesc->ContainerDuration = this->data_len / uVar1;
  ADesc->ChannelFormat = CF_NONE;
  return;
}

Assistant:

void
ASDCP::Wav::SimpleWaveHeader::FillADesc(ASDCP::PCM::AudioDescriptor& ADesc, ASDCP::Rational PictureRate) const
{
  ADesc.EditRate = PictureRate;

  ADesc.LinkedTrackID = 0;
  ADesc.Locked = 0;
  ADesc.ChannelCount = nchannels;
  ADesc.AudioSamplingRate = Rational(samplespersec, 1);
  ADesc.AvgBps = avgbps;
  ADesc.BlockAlign = blockalign;
  ADesc.QuantizationBits = bitspersample;
  ui32_t FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(ADesc);
  ADesc.ContainerDuration = data_len / FrameBufferSize;
  ADesc.ChannelFormat = PCM::CF_NONE;
}